

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::DisconnectNodes(CConnman *this)

{
  const_iterator __last;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  uint uVar2;
  ConstevalFormatString<1U> fmt;
  iterator iVar3;
  reference ppCVar4;
  iterator iVar5;
  iterator iVar6;
  pointer pTVar7;
  reference pvVar8;
  reference ppCVar9;
  Mutex *pszName;
  int iVar10;
  long in_RDI;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *this_00;
  __off64_t *__offout;
  size_t __len;
  long in_FS_OFFSET;
  list<CNode_*,_std::allocator<CNode_*>_> *__range1_1;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range1;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> *__range2;
  CNode *pnode_2;
  iterator __end1_1;
  iterator __begin1_1;
  list<CNode_*,_std::allocator<CNode_*>_> nodes_disconnected_copy;
  CNode *pnode_1;
  iterator __end1;
  iterator __begin1;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes_copy;
  iterator __end2;
  iterator __begin2;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> reconnections_to_add
  ;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock64;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  uint in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  char *in_stack_fffffffffffffd50;
  __native_type *in_stack_fffffffffffffd58;
  atomic<bool> *in_stack_fffffffffffffd60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd68;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  in_stack_fffffffffffffd70;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
  in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  CNode *in_stack_fffffffffffffd88;
  Network in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  const_iterator in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  LogFlags in_stack_fffffffffffffdb0;
  undefined1 *flag;
  undefined8 in_stack_fffffffffffffdb8;
  size_t in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  iterator iVar11;
  char *in_stack_fffffffffffffe18;
  int local_198;
  CNode *local_190;
  _List_node_base *local_188;
  _List_node_base *local_180;
  __native_type local_160;
  CNode **local_138;
  CNode **local_128;
  CNode *local_118;
  undefined8 in_stack_fffffffffffffef0;
  long *in_stack_ffffffffffffff00;
  __native_type local_e8;
  CNode **local_c0;
  CNode **local_b8;
  __off64_t local_b0 [7];
  undefined1 local_78 [104];
  ConnectionType local_10;
  undefined1 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_fffffffffffffd58->__size,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
             (RecursiveMutex *)0x1002033);
  AssertLockNotHeldInline
            (in_stack_fffffffffffffd58->__size,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
             (Mutex *)0x100205b);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::list
            ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  fmt.fmt = (char *)MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                              ((AnnotatedMixin<std::recursive_mutex> *)
                               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd88,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (char *)in_stack_fffffffffffffd78._M_current,
             (char *)in_stack_fffffffffffffd70._M_current,
             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd68 >> 0x18,0));
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffd60);
  if (!bVar1) {
    local_b8 = (CNode **)
               std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
                         ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
    local_c0 = (CNode **)
               std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                         ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
    while (bVar1 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)&in_stack_fffffffffffffd58->__data,
                              (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                               *)in_stack_fffffffffffffd50), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
      operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffd60);
      if (!bVar1) {
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
          local_e8.__align =
               CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          in_stack_fffffffffffffd58 = &local_e8;
          in_stack_fffffffffffffd50 = "Network not active, dropping peer=%d\n";
          in_stack_fffffffffffffd48 = 1;
          logging_function._M_str = in_stack_fffffffffffffe18;
          logging_function._M_len = in_stack_fffffffffffffe10;
          source_file._M_str = in_stack_fffffffffffffe08;
          source_file._M_len = in_stack_fffffffffffffe00;
          LogPrintFormatInternal<long>
                    (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                     in_stack_fffffffffffffdb0,(Level)in_stack_fffffffffffffef0,fmt,
                     in_stack_ffffffffffffff00);
        }
        std::atomic<bool>::operator=
                  ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   false);
      }
      __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
      operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    }
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
             (vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd98._M_current);
  std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
  iVar3 = std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                    ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
  while (bVar1 = __gnu_cxx::operator==<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                           ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)&in_stack_fffffffffffffd58->__data,
                            (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                             *)in_stack_fffffffffffffd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppCVar4 = __gnu_cxx::
              __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
              operator*((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                         *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_118 = *ppCVar4;
    bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffd60);
    if (bVar1) {
      std::vector<CNode_*,_std::allocator<CNode_*>_>::begin
                ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
      iVar5 = std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                        ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
      local_128 = (CNode **)
                  std::
                  remove<__gnu_cxx::__normal_iterator<CNode**,std::vector<CNode*,std::allocator<CNode*>>>,CNode*>
                            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                             (CNode **)in_stack_fffffffffffffd50);
      __gnu_cxx::__normal_iterator<CNode*const*,std::vector<CNode*,std::allocator<CNode*>>>::
      __normal_iterator<CNode**>
                ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                  *)&in_stack_fffffffffffffd58->__data,
                 (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                 in_stack_fffffffffffffd50);
      local_138 = (CNode **)
                  std::vector<CNode_*,_std::allocator<CNode_*>_>::end
                            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50)
      ;
      __gnu_cxx::__normal_iterator<CNode*const*,std::vector<CNode*,std::allocator<CNode*>>>::
      __normal_iterator<CNode**>
                ((__normal_iterator<CNode_*const_*,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                  *)&in_stack_fffffffffffffd58->__data,
                 (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
                 in_stack_fffffffffffffd50);
      __last._M_current._4_4_ = in_stack_fffffffffffffd94;
      __last._M_current._0_4_ = in_stack_fffffffffffffd90;
      iVar6 = std::vector<CNode_*,_std::allocator<CNode_*>_>::erase
                        (in_stack_fffffffffffffd70._M_current,in_stack_fffffffffffffd98,__last);
      iVar11 = iVar6;
      pTVar7 = std::unique_ptr<Transport,_std::default_delete<Transport>_>::operator->
                         ((unique_ptr<Transport,_std::default_delete<Transport>_> *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      iVar10 = (int)((ulong)iVar6._M_current >> 0x20);
      uVar2 = (*pTVar7->_vptr_Transport[10])();
      if ((uVar2 & 1) != 0) {
        flag = local_78;
        CAddress::CAddress((CAddress *)&in_stack_fffffffffffffd58->__data,
                           (CAddress *)in_stack_fffffffffffffd50);
        CSemaphoreGrant::CSemaphoreGrant
                  ((CSemaphoreGrant *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (CSemaphoreGrant *)0x1002496);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd88);
        local_10 = local_118->m_conn_type;
        local_c = 0;
        std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
        ::push_back((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *
                    )&in_stack_fffffffffffffd58->__data,(value_type *)in_stack_fffffffffffffd50);
        ReconnectionInfo::~ReconnectionInfo
                  ((ReconnectionInfo *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                  );
        bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                    Trace);
        if (bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
          in_stack_fffffffffffffd50 = "retrying with v1 transport protocol for peer=%d\n";
          in_stack_fffffffffffffd98._M_current =
               (CNode **)
               CNode::GetId((CNode *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          in_stack_fffffffffffffd58 = &local_160;
          in_stack_fffffffffffffd48 = 1;
          logging_function_00._M_str = (char *)iVar5._M_current;
          logging_function_00._M_len = (size_t)iVar11._M_current;
          source_file_00._M_str = in_stack_fffffffffffffd50;
          source_file_00._M_len = in_stack_fffffffffffffe00;
          local_160.__align = (long)in_stack_fffffffffffffd98._M_current;
          LogPrintFormatInternal<long>
                    (logging_function_00,source_file_00,iVar10,(LogFlags)flag,
                     (Level)iVar3._M_current,fmt,in_stack_ffffffffffffff00);
        }
      }
      CSemaphoreGrant::Release
                ((CSemaphoreGrant *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      CNode::CloseSocketDisconnect(in_stack_fffffffffffffd88);
      bVar1 = CNode::IsManualOrFullOutboundConn((CNode *)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd94 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd94);
      if (bVar1) {
        in_stack_fffffffffffffd88 = (CNode *)(in_RDI + 0x1dc);
        in_stack_fffffffffffffd90 = CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffd50);
        pvVar8 = std::array<unsigned_int,_7UL>::operator[]
                           ((array<unsigned_int,_7UL> *)&in_stack_fffffffffffffd58->__data,
                            (size_type)in_stack_fffffffffffffd50);
        *pvVar8 = *pvVar8 - 1;
      }
      CNode::Release((CNode *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::push_back
                ((list<CNode_*,_std::allocator<CNode_*>_> *)&in_stack_fffffffffffffd58->__data,
                 (value_type *)in_stack_fffffffffffffd50);
    }
    __gnu_cxx::__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>::
    operator++((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::~vector
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)&in_stack_fffffffffffffd58->__data);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::list
            ((list<CNode_*,_std::allocator<CNode_*>_> *)
             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd88);
  local_180 = (_List_node_base *)
              std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::begin
                        ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
  local_188 = (_List_node_base *)
              std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::end
                        ((list<CNode_*,_std::allocator<CNode_*>_> *)in_stack_fffffffffffffd50);
  while (bVar1 = std::operator==((_Self *)&in_stack_fffffffffffffd58->__data,
                                 (_Self *)in_stack_fffffffffffffd50), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppCVar9 = std::_List_iterator<CNode_*>::operator*
                        ((_List_iterator<CNode_*> *)
                         CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    local_190 = *ppCVar9;
    in_stack_fffffffffffffd84 = CNode::GetRefCount((CNode *)&in_stack_fffffffffffffd58->__data);
    if (in_stack_fffffffffffffd84 < 1) {
      std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::remove
                ((list<CNode_*,_std::allocator<CNode_*>_> *)(in_RDI + 400),(char *)&local_190);
      DeleteNode((CConnman *)&in_stack_fffffffffffffd58->__data,(CNode *)in_stack_fffffffffffffd50);
    }
    std::_List_iterator<CNode_*>::operator++
              ((_List_iterator<CNode_*> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  }
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::~list
            ((list<CNode_*,_std::allocator<CNode_*>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  pszName = MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48)
                             );
  iVar10 = 0x1cfaac5;
  __offout = (__off64_t *)0x78e;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffd88,
             (AnnotatedMixin<std::mutex> *)
             CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),(char *)pszName,
             (char *)in_stack_fffffffffffffd70._M_current,
             (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffd68 >> 0x18,0));
  this_00 = (list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
            (in_RDI + 0x468);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::end
            ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
             in_stack_fffffffffffffd50);
  std::_List_const_iterator<CConnman::ReconnectionInfo>::_List_const_iterator
            ((_List_const_iterator<CConnman::ReconnectionInfo> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(iterator *)0x10028f3);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
  splice(this_00,local_198,local_b0,iVar10,__offout,__len,in_stack_fffffffffffffd48);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::~list
            ((list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> *)
             CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::DisconnectNodes()
{
    AssertLockNotHeld(m_nodes_mutex);
    AssertLockNotHeld(m_reconnections_mutex);

    // Use a temporary variable to accumulate desired reconnections, so we don't need
    // m_reconnections_mutex while holding m_nodes_mutex.
    decltype(m_reconnections) reconnections_to_add;

    {
        LOCK(m_nodes_mutex);

        if (!fNetworkActive) {
            // Disconnect any connected nodes
            for (CNode* pnode : m_nodes) {
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "Network not active, dropping peer=%d\n", pnode->GetId());
                    pnode->fDisconnect = true;
                }
            }
        }

        // Disconnect unused nodes
        std::vector<CNode*> nodes_copy = m_nodes;
        for (CNode* pnode : nodes_copy)
        {
            if (pnode->fDisconnect)
            {
                // remove from m_nodes
                m_nodes.erase(remove(m_nodes.begin(), m_nodes.end(), pnode), m_nodes.end());

                // Add to reconnection list if appropriate. We don't reconnect right here, because
                // the creation of a connection is a blocking operation (up to several seconds),
                // and we don't want to hold up the socket handler thread for that long.
                if (pnode->m_transport->ShouldReconnectV1()) {
                    reconnections_to_add.push_back({
                        .addr_connect = pnode->addr,
                        .grant = std::move(pnode->grantOutbound),
                        .destination = pnode->m_dest,
                        .conn_type = pnode->m_conn_type,
                        .use_v2transport = false});
                    LogDebug(BCLog::NET, "retrying with v1 transport protocol for peer=%d\n", pnode->GetId());
                }

                // release outbound grant (if any)
                pnode->grantOutbound.Release();

                // close socket and cleanup
                pnode->CloseSocketDisconnect();

                // update connection count by network
                if (pnode->IsManualOrFullOutboundConn()) --m_network_conn_counts[pnode->addr.GetNetwork()];

                // hold in disconnected pool until all refs are released
                pnode->Release();
                m_nodes_disconnected.push_back(pnode);
            }
        }
    }
    {
        // Delete disconnected nodes
        std::list<CNode*> nodes_disconnected_copy = m_nodes_disconnected;
        for (CNode* pnode : nodes_disconnected_copy)
        {
            // Destroy the object only after other threads have stopped using it.
            if (pnode->GetRefCount() <= 0) {
                m_nodes_disconnected.remove(pnode);
                DeleteNode(pnode);
            }
        }
    }
    {
        // Move entries from reconnections_to_add to m_reconnections.
        LOCK(m_reconnections_mutex);
        m_reconnections.splice(m_reconnections.end(), std::move(reconnections_to_add));
    }
}